

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 floatx80_to_float128_sparc64(floatx80 a,float_status *status)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  float128 fVar6;
  float128 fVar7;
  float128 fVar8;
  float128 fVar9;
  
  uVar5 = a.low;
  uVar1 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar5)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar6.high = 0x7fffffffffffffff;
    fVar6.low = 0xffffffffffffffff;
    return fVar6;
  }
  uVar4 = (uint)(ushort)(a.high >> 0xf);
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      uVar1 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) &&
       (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
    if (status->default_nan_mode == '\0') {
      uVar2 = uVar5 * 2;
      uVar3 = (ulong)uVar4 << 0x3f;
      if (-1 < (long)uVar5) {
        uVar2 = 0x8000000000000000;
        uVar3 = 0x8000000000000000;
      }
      fVar9.low = uVar2 << 0x30;
      fVar9.high = uVar2 >> 0x10 | 0x7fff000000000000 | uVar3;
      return fVar9;
    }
    fVar8.high = 0x7fffffffffffffff;
    fVar8.low = 0xffffffffffffffff;
    return fVar8;
  }
  fVar7.high = (ulong)uVar1 << 0x30 | (ulong)uVar4 << 0x3f | uVar5 >> 0xf & 0xffffffffffff;
  fVar7.low = uVar5 << 0x31;
  return fVar7;
}

Assistant:

float128 floatx80_to_float128(floatx80 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) {
        return commonNaNToFloat128(floatx80ToCommonNaN(a, status), status);
    }
    shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp, zSig0, zSig1 );

}